

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cborparser.c
# Opt level: O0

CborError advance_internal(CborValue *it)

{
  CborError CVar1;
  CborValue *it_00;
  long in_RDI;
  CborValue *unaff_retaddr;
  uint64_t length;
  CborValue *in_stack_ffffffffffffffe8;
  
  it_00 = (CborValue *)extract_number_and_advance(unaff_retaddr);
  if ((*(char *)(in_RDI + 0x16) == '@') || (*(char *)(in_RDI + 0x16) == '`')) {
    advance_bytes(it_00,(size_t)in_stack_ffffffffffffffe8);
  }
  CVar1 = preparse_next_value(in_stack_ffffffffffffffe8);
  return CVar1;
}

Assistant:

static CborError advance_internal(CborValue *it)
{
    uint64_t length = extract_number_and_advance(it);

    if (it->type == CborByteStringType || it->type == CborTextStringType) {
        cbor_assert(length == (size_t)length);
        cbor_assert((it->flags & CborIteratorFlag_UnknownLength) == 0);
        advance_bytes(it, length);
    }

    return preparse_next_value(it);
}